

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

bool __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::ends_with
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> *v)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> *v_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_18 = v;
  v_local = this;
  sVar2 = size(this);
  sVar3 = size(v);
  local_29 = false;
  if (sVar3 <= sVar2) {
    sVar2 = size(this);
    sVar3 = size(v);
    basic_string_view(&local_28,v);
    iVar1 = compare(this,sVar2 - sVar3,0xffffffffffffffff,&local_28);
    local_29 = iVar1 == 0;
  }
  return local_29;
}

Assistant:

nssv_constexpr bool ends_with( basic_string_view v ) const nssv_noexcept  // (1)
    {
        return size() >= v.size() && compare( size() - v.size(), npos, v ) == 0;
    }